

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::dfsForRandomIterative(Graph *this)

{
  size_type __n;
  size_type __n_00;
  ulong uVar1;
  value_type *pvVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  value_type *pvVar7;
  result_type_conflict rVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  size_type local_160;
  value_type *e_1;
  uint64_t i_1;
  uint64_t u_1;
  undefined1 *local_108;
  value_type local_100;
  size_type local_f0;
  uint64_t v;
  value_type *e;
  uint64_t i;
  uint64_t u;
  uint64_t local_c8;
  undefined1 local_b0 [8];
  stack<Node,_std::deque<Node,_std::allocator<Node>_>_> stack;
  stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_> ostov;
  Graph *this_local;
  
  std::
  stack<Graph::dfsForRandomIterative()::Tree,std::deque<Graph::dfsForRandomIterative()::Tree,std::allocator<Graph::dfsForRandomIterative()::Tree>>>
  ::
  stack<std::deque<Graph::dfsForRandomIterative()::Tree,std::allocator<Graph::dfsForRandomIterative()::Tree>>,void>
            ((stack<Graph::dfsForRandomIterative()::Tree,std::deque<Graph::dfsForRandomIterative()::Tree,std::allocator<Graph::dfsForRandomIterative()::Tree>>>
              *)&stack.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node);
  std::
  stack<Graph::dfsForRandomIterative()::Node,std::deque<Graph::dfsForRandomIterative()::Node,std::allocator<Graph::dfsForRandomIterative()::Node>>>
  ::
  stack<std::deque<Graph::dfsForRandomIterative()::Node,std::allocator<Graph::dfsForRandomIterative()::Node>>,void>
            ((stack<Graph::dfsForRandomIterative()::Node,std::deque<Graph::dfsForRandomIterative()::Node,std::allocator<Graph::dfsForRandomIterative()::Node>>>
              *)local_b0);
  u = 0;
  local_c8 = 0;
  std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::push
            ((stack<Node,_std::deque<Node,_std::allocator<Node>_>_> *)local_b0,(value_type *)&u);
  pvVar4 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::operator[](&this->colorMap,0)
  ;
  *pvVar4 = Grey;
  while (bVar3 = std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::empty
                           ((stack<Node,_std::deque<Node,_std::allocator<Node>_>_> *)local_b0),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::top
                       ((stack<Node,_std::deque<Node,_std::allocator<Node>_>_> *)local_b0);
    i = pvVar5->vertex;
    pvVar5 = std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::top
                       ((stack<Node,_std::deque<Node,_std::allocator<Node>_>_> *)local_b0);
    e = (value_type *)pvVar5->start;
    std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::pop
              ((stack<Node,_std::deque<Node,_std::allocator<Node>_>_> *)local_b0);
    while( true ) {
      pvVar2 = e;
      pvVar6 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&this->matrix,i);
      pvVar7 = (value_type *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar6);
      if (pvVar7 <= pvVar2) break;
      pvVar6 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&this->matrix,i);
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (pvVar6,(size_type)e);
      v = (uint64_t)
          std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::operator[](&this->edges,*pvVar11);
      if ((((reference)v)->super_LightEdge).u == i) {
        local_160 = (((reference)v)->super_LightEdge).v;
      }
      else {
        local_160 = (((reference)v)->super_LightEdge).u;
      }
      local_f0 = local_160;
      if ((((reference)v)->finished & 1U) == 0) {
        ((reference)v)->finished = true;
        pvVar4 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::operator[]
                           (&this->colorMap,local_160);
        if (*pvVar4 == White) {
          local_100.vertex = local_f0;
          pvVar6 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](&this->matrix,i);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (pvVar6,(size_type)e);
          local_100.edge = *pvVar11;
          std::stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_>::push
                    ((stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_> *)
                     &stack.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node,&local_100);
          u_1 = i;
          local_108 = (undefined1 *)((long)&(e->super_LightEdge).u + 1);
          std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::push
                    ((stack<Node,_std::deque<Node,_std::allocator<Node>_>_> *)local_b0,
                     (value_type *)&u_1);
          i = local_f0;
          pvVar4 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::operator[]
                             (&this->colorMap,local_f0);
          *pvVar4 = Grey;
          e = (value_type *)0x0;
        }
        else {
          rVar8 = std::uniform_int_distribution<unsigned_long>::operator()(&rand,&engine);
          *(result_type_conflict *)(v + 0x18) = rVar8;
          uVar1 = *(ulong *)(v + 0x18);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->sums,local_f0);
          *pvVar11 = uVar1 ^ *pvVar11;
          uVar1 = *(ulong *)(v + 0x18);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->sums,i);
          *pvVar11 = uVar1 ^ *pvVar11;
          e = (value_type *)((long)&(e->super_LightEdge).u + 1);
        }
      }
      else {
        e = (value_type *)((long)&(e->super_LightEdge).u + 1);
      }
    }
    pvVar4 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::operator[]
                       (&this->colorMap,i);
    *pvVar4 = Black;
  }
  while (bVar3 = std::stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_>::empty
                           ((stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_> *)
                            &stack.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_node), ((bVar3 ^ 0xffU) & 1) != 0)
  {
    pvVar9 = std::stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_>::top
                       ((stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_> *)
                        &stack.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node);
    __n = pvVar9->vertex;
    pvVar9 = std::stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_>::top
                       ((stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_> *)
                        &stack.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node);
    __n_00 = pvVar9->edge;
    std::stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_>::pop
              ((stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_> *)
               &stack.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
    pvVar10 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::operator[]
                        (&this->edges,__n_00);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&this->sums,__n);
    pvVar10->shift = *pvVar11;
    uVar1 = pvVar10->shift;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&this->sums,(pvVar10->super_LightEdge).v);
    *pvVar11 = uVar1 ^ *pvVar11;
    uVar1 = pvVar10->shift;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&this->sums,(pvVar10->super_LightEdge).u);
    *pvVar11 = uVar1 ^ *pvVar11;
  }
  std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::~stack
            ((stack<Node,_std::deque<Node,_std::allocator<Node>_>_> *)local_b0);
  std::stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_>::~stack
            ((stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_> *)
             &stack.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  return;
}

Assistant:

void Graph::dfsForRandomIterative() {
    struct Node {
        std::uint64_t vertex;
        std::uint64_t start;
    };

    struct Tree {
        std::uint64_t vertex;
        std::uint64_t edge;
    };

    std::stack<Tree> ostov;
    std::stack<Node> stack;
    stack.push({0, 0});

    colorMap[0] = Colors::Grey;
    while (!stack.empty()) {
        std::uint64_t u = stack.top().vertex;
        std::uint64_t i = stack.top().start;
        stack.pop();

        while (i < matrix[u].size()) {
            auto &e = edges[matrix[u][i]];
            std::uint64_t v = ((e.u != u) ? e.u : e.v);

            if (e.finished) {
                ++i;
                continue;
            }

            e.finished = true;
            if (colorMap[v] == Colors::White) {
                ostov.push({v, matrix[u][i]});
                stack.push({u, i + 1});

                u = v;
                colorMap[u] = Colors::Grey;
                i = 0;
            } else {
                e.shift = rand(engine);
                sums[v] ^= e.shift;
                sums[u] ^= e.shift;
                ++i;
            }
        }

        colorMap[u] = Colors::Black;
    }

    while (!ostov.empty()) {
        std::uint64_t u = ostov.top().vertex;
        std::uint64_t i = ostov.top().edge;
        ostov.pop();

        auto &e = edges[i];
        e.shift = sums[u];
        sums[e.v] ^= e.shift;
        sums[e.u] ^= e.shift;
    }
}